

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  pointer piVar1;
  char cVar2;
  uint uVar3;
  int32_t i;
  long lVar4;
  int iVar5;
  entry e;
  
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::clear(&this->words_);
  piVar1 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 30000000; lVar4 = lVar4 + 1) {
    piVar1[lVar4] = -1;
  }
  std::istream::read((char *)in,(long)&this->size_);
  std::istream::read((char *)in,(long)&this->nwords_);
  std::istream::read((char *)in,(long)&this->nlabels_);
  std::istream::read((char *)in,(long)&this->ntokens_);
  for (iVar5 = 0; iVar5 < this->size_; iVar5 = iVar5 + 1) {
    e.word._M_string_length = 0;
    e.word.field_2._M_local_buf[0] = '\0';
    e.subngram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    e.subngram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    e.subipangram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    e.subipangram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    e.subipangram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    e.subngram.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    e.sublemma.subword._M_string_length = 0;
    e.sublemma.subword.field_2._M_local_buf[0] = '\0';
    e.submorph.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
    e.submorph.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    e.actual_word._M_dataplus._M_p = (pointer)&e.actual_word.field_2;
    e.actual_word._M_string_length = 0;
    e.actual_word.field_2._M_local_buf[0] = '\0';
    e.word._M_dataplus._M_p = (pointer)&e.word.field_2;
    e.sublemma.subword._M_dataplus._M_p = (pointer)&e.sublemma.subword.field_2;
    while( true ) {
      cVar2 = std::istream::get();
      if (cVar2 == '\0') break;
      std::__cxx11::string::push_back((char)&e);
    }
    std::istream::read((char *)in,(long)&e.count);
    std::istream::read((char *)in,(long)&e.type);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back(&this->words_,&e);
    uVar3 = find(this,&e.word);
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3] = iVar5;
    entry::~entry(&e);
  }
  initTableDiscard(this);
  initNgrams(this);
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  for (int32_t i = 0; i < MAX_VOCAB_SIZE; i++) {
    word2int_[i] = -1;
  }
  in.read((char*) &size_, sizeof(int32_t));
  in.read((char*) &nwords_, sizeof(int32_t));
  in.read((char*) &nlabels_, sizeof(int32_t));
  in.read((char*) &ntokens_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*) &e.count, sizeof(int64_t));
    in.read((char*) &e.type, sizeof(entry_type));
    words_.push_back(e);
    word2int_[find(e.word)] = i;
  }
  initTableDiscard();
  initNgrams();
}